

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

bool __thiscall
pstore::json::details::number_matcher<(anonymous_namespace)::yaml_output>::
do_integer_initial_digit_state
          (number_matcher<(anonymous_namespace)::yaml_output> *this,
          parser<(anonymous_namespace)::yaml_output> *parser,char c)

{
  byte in_AL;
  error_code local_20;
  
  if ((this->super_matcher<(anonymous_namespace)::yaml_output>).state_ != 3) {
    assert_failed("this->get_state () == integer_initial_digit_state",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                  ,0x2c3);
  }
  if ((this->super_matcher<(anonymous_namespace)::yaml_output>).field_0xd != '\0') {
    if (c == '0') {
      (this->super_matcher<(anonymous_namespace)::yaml_output>).state_ = 5;
    }
    else if ((byte)(c - 0x31U) < 9) {
      if (this->int_acc_ != 0) {
        assert_failed("int_acc_ == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                      ,0x2c8);
      }
      in_AL = c - 0x30;
      this->int_acc_ = (ulong)in_AL;
      (this->super_matcher<(anonymous_namespace)::yaml_output>).state_ = 4;
    }
    else {
      local_20._M_cat = get_error_category();
      local_20._M_value = 0xb;
      in_AL = matcher<(anonymous_namespace)::yaml_output>::set_error
                        (&this->super_matcher<(anonymous_namespace)::yaml_output>,parser,&local_20);
    }
    return (bool)in_AL;
  }
  assert_failed("is_integer_",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                ,0x2c4);
}

Assistant:

bool
            number_matcher<Callbacks>::do_integer_initial_digit_state (parser<Callbacks> & parser,
                                                                       char const c) {
                PSTORE_ASSERT (this->get_state () == integer_initial_digit_state);
                PSTORE_ASSERT (is_integer_);
                if (c == '0') {
                    this->set_state (frac_state);
                } else if (c >= '1' && c <= '9') {
                    PSTORE_ASSERT (int_acc_ == 0);
                    int_acc_ = static_cast<unsigned> (c - '0');
                    this->set_state (integer_digit_state);
                } else {
                    this->set_error (parser, error_code::unrecognized_token);
                }
                return true;
            }